

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O2

void __thiscall fasttext::AutotuneStrategy::updateBest(AutotuneStrategy *this,Args *args)

{
  int iVar1;
  AutotuneStrategy *this_00;
  double dVar2;
  
  this_00 = this;
  Args::operator=(&this->bestArgs_,args);
  iVar1 = getIndex(this_00,args->minn,&this->minnChoices_);
  this->bestMinnIndex_ = iVar1;
  dVar2 = log2(((double)CONCAT44(0x45300000,(int)(args->dsub >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)args->dsub) - 4503599627370496.0));
  this->bestDsubExponent_ = (int)dVar2;
  if (args->bucket != 0) {
    this->bestNonzeroBucket_ = args->bucket;
  }
  return;
}

Assistant:

void AutotuneStrategy::updateBest(const Args& args) {
  bestArgs_ = args;
  bestMinnIndex_ = getIndex(args.minn, minnChoices_);
  bestDsubExponent_ = log2(args.dsub);
  if (args.bucket != 0) {
    bestNonzeroBucket_ = args.bucket;
  }
}